

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *bs;
  ssh_sharing_connstate *cs;
  void *pvVar1;
  byte bVar2;
  _func_int_Plug_ptr_accept_fn_t_accept_ctx_t *p_Var3;
  size_t sVar4;
  _Bool _Var5;
  char cVar6;
  _Bool val;
  code cVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  uint upstream_id;
  char *pcVar11;
  unsigned_long uVar12;
  share_channel *psVar13;
  unsigned_long uVar14;
  undefined8 *e;
  char *pcVar15;
  undefined8 *puVar16;
  _func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *p_Var17;
  unsigned_long uVar18;
  X11FakeAuth *pXVar19;
  strbuf *buf_o;
  share_halfchannel *psVar20;
  share_xchannel *psVar21;
  void *pvVar22;
  PlugVtable *pPVar23;
  undefined4 uVar24;
  ulong uVar25;
  undefined4 in_register_00000034;
  long lVar26;
  ptrlen pVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  ssh_sharing_connstate *psVar30;
  int local_98;
  BinarySource local_88;
  share_xchannel *local_60;
  unsigned_long local_58;
  size_t local_50;
  char *local_48;
  undefined4 local_40;
  
  cs = (ssh_sharing_connstate *)(plug + -0x810);
  iVar8 = *(int *)&plug[-0x80d].vt;
  if (iVar8 == 0x71b) goto LAB_00136bfa;
  if (iVar8 != 0x6e9) {
    if (iVar8 == 0x70e) goto LAB_00136b40;
    uVar24 = 0;
    if (iVar8 != 0) goto LAB_00136bb4;
    plug[-9].vt = (PlugVtable *)0x0;
  }
  lVar26 = -len;
  pcVar11 = data;
  while( true ) {
    lVar26 = lVar26 + 1;
    data = pcVar11 + 1;
    if (lVar26 == 1) break;
    cVar6 = *pcVar11;
    pPVar23 = plug[-9].vt;
    if (cVar6 == '\n') {
      if ((PlugVtable *)0x2d < pPVar23) {
        pvVar1 = (void *)((long)&plug[-0x80c].vt + 4);
        iVar8 = bcmp(pvVar1,"SSHCONNECTION@putty.projects.tartarus.org-2.0-",0x2e);
        if (iVar8 == 0) {
          if (((undefined1 *)((long)&plug[-0x80c].vt + 3))[(long)pPVar23] == '\r') {
            pPVar23 = (PlugVtable *)((long)&pPVar23[-1].accepting + 7);
            plug[-9].vt = pPVar23;
          }
          uVar9 = string_length_for_printf((size_t)pPVar23);
          log_downstream(cs,"Downstream version string: %.*s",(ulong)uVar9,pvVar1);
          *(undefined1 *)((long)&plug[-0x80d].vt + 5) = 1;
          len = -lVar26;
          goto LAB_00136b32;
        }
      }
      pcVar11 = dupprintf("Version string did not have expected prefix\n");
      goto LAB_00136b9d;
    }
    if ((PlugVtable *)0x400f < pPVar23) {
      pcVar11 = dupprintf("Version string far too long\n",CONCAT44(in_register_00000034,urgent));
      goto LAB_00136b9d;
    }
    plug[-9].vt = (PlugVtable *)((long)&pPVar23->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar23] = cVar6;
    pcVar11 = data;
  }
  uVar24 = 0x6e9;
LAB_00136bb4:
  *(undefined4 *)&plug[-0x80d].vt = uVar24;
  return;
LAB_00136b32:
  plug[-9].vt = (PlugVtable *)0x0;
  pPVar23 = (PlugVtable *)0x0;
  while (pPVar23 < (PlugVtable *)0x4) {
LAB_00136b40:
    if (len == 0) {
      uVar24 = 0x70e;
      goto LAB_00136bb4;
    }
    len = len - 1;
    cVar6 = *data;
    data = data + 1;
    pPVar23 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar23->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar23] = cVar6;
    pPVar23 = plug[-9].vt;
  }
  uVar10 = GET_32BIT_MSB_FIRST((void *)((long)&plug[-0x80c].vt + 4));
  iVar8 = uVar10 + 4;
  *(int *)&plug[-0x80c].vt = iVar8;
  if (uVar10 - 0x400d < 0xffffbff4) {
    pcVar11 = dupprintf("Bad packet length %u\n");
LAB_00136b9d:
    uVar24 = 0;
    share_disconnect(cs,pcVar11);
    safefree(pcVar11);
    goto LAB_00136bb4;
  }
  while (pPVar23 < (PlugVtable *)(long)iVar8) {
LAB_00136bfa:
    if (len == 0) {
      uVar24 = 0x71b;
      goto LAB_00136bb4;
    }
    len = len - 1;
    cVar6 = *data;
    data = data + 1;
    pPVar23 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar23->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar23] = cVar6;
    iVar8 = *(int *)&plug[-0x80c].vt;
    pPVar23 = plug[-9].vt;
  }
  bVar2 = *(byte *)&plug[-0x80b].vt;
  uVar25 = (ulong)bVar2;
  pvVar1 = (void *)((long)&plug[-0x80b].vt + 1);
  iVar8 = (int)pPVar23 + -5;
  local_88.len = (size_t)iVar8;
  local_88.binarysource_ = &local_88;
  local_88.pos = 0;
  local_88.err = BSE_NO_ERROR;
  local_88.data = pvVar1;
  local_50 = len;
  switch(bVar2) {
  case 0x50:
    pVar27 = BinarySource_get_string(&local_88);
    sVar4 = local_88.pos;
    cVar7 = (code)BinarySource_get_bool(local_88.binarysource_);
    _Var5 = ptrlen_eq_string(pVar27,"tcpip-forward");
    if (_Var5) {
      pVar27 = BinarySource_get_string(local_88.binarysource_);
      uVar12 = BinarySource_get_uint32(local_88.binarysource_);
      if ((local_88.binarysource_)->err != BSE_NO_ERROR) {
LAB_00137133:
        pcVar11 = "Truncated GLOBAL_REQUEST packet";
        goto LAB_0013718f;
      }
      pcVar11 = mkstr(pVar27);
      p_Var3 = (plug[-0x80e].vt)->accepting;
      uVar28 = 0;
      uVar29 = 0;
      psVar30 = cs;
      lVar26 = (*(code *)**(undefined8 **)(p_Var3 + 8))(p_Var3,pcVar11,uVar12 & 0xffffffff);
      if (lVar26 == 0) {
        if ((bool)cVar7) {
          send_packet_to_downstream(cs,0x52,anon_var_dwarf_331ec + 10,0,(share_channel *)0x0);
        }
      }
      else {
        *(undefined1 *)((long)plug + (sVar4 - 0x4057)) = 1;
        p_Var3 = (plug[-0x80e].vt)->accepting;
        pcVar15 = "upstream added want_reply flag";
        if ((bool)cVar7) {
          pcVar15 = (char *)0x0;
        }
        (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                  (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar1,iVar8,pcVar15,uVar28,uVar29,
                   psVar30);
        e = (undefined8 *)safemalloc(1,0x18,0);
        pcVar15 = dupstr(pcVar11);
        *e = pcVar15;
        *(int *)(e + 1) = (int)uVar12;
        *(undefined1 *)((long)e + 0xc) = 0;
        puVar16 = (undefined8 *)add234((tree234 *)plug[-3].vt,e);
        if (puVar16 != e) {
          safefree(e);
          e = (undefined8 *)0x0;
        }
        p_Var3 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var3 + 8) + 0x60))(p_Var3,cs);
        if (e != (undefined8 *)0x0) {
          p_Var17 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                    safemalloc(1,0x18,0);
          *(undefined8 *)p_Var17 = 0;
          pPVar23 = (PlugVtable *)(plug + -2);
          if (plug[-1].vt != (PlugVtable *)0x0) {
            pPVar23 = plug[-1].vt;
          }
          pPVar23->log = p_Var17;
          *(undefined8 **)(p_Var17 + 0x10) = e;
          p_Var17[0xc] = cVar7;
          *(undefined4 *)(p_Var17 + 8) = 0;
          e[2] = lVar26;
        }
      }
      goto LAB_001371b5;
    }
    _Var5 = ptrlen_eq_string(pVar27,"cancel-tcpip-forward");
    if (!_Var5) {
      len = local_50;
      if ((bool)cVar7) {
        send_packet_to_downstream(cs,0x52,anon_var_dwarf_331ec + 10,0,(share_channel *)0x0);
        len = local_50;
      }
      goto LAB_00136b32;
    }
    pVar27 = BinarySource_get_string(local_88.binarysource_);
    uVar12 = BinarySource_get_uint32(local_88.binarysource_);
    if ((local_88.binarysource_)->err != BSE_NO_ERROR) goto LAB_00137133;
    pcVar11 = mkstr(pVar27);
    local_48 = dupstr(pcVar11);
    local_40 = (undefined4)uVar12;
    pvVar22 = find234((tree234 *)plug[-3].vt,&local_48,(cmpfn234)0x0);
    safefree(local_48);
    if (pvVar22 == (void *)0x0) {
      if ((bool)cVar7) {
        send_packet_to_downstream(cs,0x52,anon_var_dwarf_331ec + 10,0,(share_channel *)0x0);
      }
    }
    else {
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 8))(p_Var3,*(undefined8 *)((long)pvVar22 + 0x10));
      *(undefined1 *)((long)plug + (sVar4 - 0x4057)) = 1;
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar1);
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 0x60))(p_Var3,cs);
      p_Var17 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                safemalloc(1,0x18,0);
      *(undefined8 *)p_Var17 = 0;
      pPVar23 = (PlugVtable *)(plug + -2);
      if (plug[-1].vt != (PlugVtable *)0x0) {
        pPVar23 = plug[-1].vt;
      }
      pPVar23->log = p_Var17;
      *(void **)(p_Var17 + 0x10) = pvVar22;
      p_Var17[0xc] = cVar7;
      *(undefined4 *)(p_Var17 + 8) = 1;
    }
    goto LAB_001371b5;
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
switchD_00136c56_caseD_51:
    pcVar11 = "Unexpected packet type %d\n";
    goto LAB_00136e0b;
  case 0x5a:
    BinarySource_get_string(&local_88);
    sVar4 = local_88.pos;
    uVar12 = BinarySource_get_uint32(local_88.binarysource_);
    p_Var3 = (plug[-0x80e].vt)->accepting;
    uVar9 = (**(code **)(*(long *)(p_Var3 + 8) + 0x50))(p_Var3,cs);
    BinarySource_get_uint32(local_88.binarysource_);
    uVar14 = BinarySource_get_uint32(local_88.binarysource_);
    if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
      share_add_channel(cs,(uint)uVar12,uVar9,0,3,(int)uVar14);
      *(uint *)((long)plug + (sVar4 - 0x4057)) =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x5a,pvVar1);
      len = local_50;
      goto LAB_00136b32;
    }
    pcVar11 = "Truncated CHANNEL_OPEN packet";
LAB_001370ca:
    pcVar11 = dupprintf(pcVar11);
    break;
  case 0x5b:
    if (iVar8 < 0x10) {
      pcVar11 = "Truncated CHANNEL_OPEN_CONFIRMATION packet";
      goto LAB_001370ca;
    }
    uVar12 = BinarySource_get_uint32(&local_88);
    sVar4 = local_88.pos;
    uVar14 = BinarySource_get_uint32(local_88.binarysource_);
    BinarySource_get_uint32(local_88.binarysource_);
    uVar18 = BinarySource_get_uint32(local_88.binarysource_);
    if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
      uVar9 = (uint)uVar12;
      local_58 = uVar18;
      psVar20 = share_find_halfchannel(cs,uVar9);
      if (psVar20 == (share_halfchannel *)0x0) {
        psVar21 = share_find_xchannel_by_server(cs,uVar9);
        if (psVar21 == (share_xchannel *)0x0) {
          pcVar11 = "CHANNEL_OPEN_CONFIRMATION packet cited unknown channel %u";
          goto LAB_00137675;
        }
        upstream_id = psVar21->upstream_id;
        local_60 = psVar21;
      }
      else {
        p_Var3 = (plug[-0x80e].vt)->accepting;
        upstream_id = (**(code **)(*(long *)(p_Var3 + 8) + 0x50))(p_Var3,cs);
        local_60 = (share_xchannel *)0x0;
      }
      *(uint *)((long)pvVar1 + sVar4) =
           upstream_id >> 0x18 | (upstream_id & 0xff0000) >> 8 | (upstream_id & 0xff00) << 8 |
           upstream_id << 0x18;
      psVar13 = share_add_channel(cs,(uint)uVar14,upstream_id,uVar9,0,(int)local_58);
      psVar21 = local_60;
      if (psVar20 == (share_halfchannel *)0x0) {
        len = local_50;
        if (local_60 != (share_xchannel *)0x0) {
          uVar10 = GET_32BIT_MSB_FIRST((void *)((long)&plug[-0x80a].vt + 1));
          if (uVar10 < 0x100) {
            pcVar11 = "Initial window size for x11 channel must be at least 256 (got %u)";
            uVar25 = (ulong)uVar10;
            goto LAB_00136e0b;
          }
          share_xchannel_confirmation(cs,psVar21,psVar13,uVar10);
          share_remove_xchannel(cs,psVar21);
          len = local_50;
        }
      }
      else {
        p_Var3 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                  (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x5b,pvVar1);
        share_remove_halfchannel(cs,psVar20);
        len = local_50;
      }
      goto LAB_00136b32;
    }
    pcVar11 = "Truncated CHANNEL_OPEN_CONFIRMATION packet";
LAB_0013718f:
    pcVar11 = dupprintf(pcVar11);
    break;
  case 0x5c:
    uVar12 = BinarySource_get_uint32(&local_88);
    if ((local_88.binarysource_)->err != BSE_NO_ERROR) {
      pcVar11 = "Truncated CHANNEL_OPEN_FAILURE packet";
      goto LAB_0013718f;
    }
    psVar20 = share_find_halfchannel(cs,(uint)uVar12);
    if (psVar20 != (share_halfchannel *)0x0) {
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x5c,pvVar1);
      share_remove_halfchannel(cs,psVar20);
      len = local_50;
      goto LAB_00136b32;
    }
    psVar21 = share_find_xchannel_by_server(cs,(uint)uVar12);
    if (psVar21 != (share_xchannel *)0x0) {
      share_xchannel_failure(cs,psVar21);
      len = local_50;
      goto LAB_00136b32;
    }
    pcVar11 = "CHANNEL_OPEN_FAILURE packet cited unknown channel %u";
LAB_00137675:
    uVar25 = uVar12 & 0xffffffff;
LAB_00136e0b:
    pcVar11 = dupprintf(pcVar11,uVar25);
    break;
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
switchD_00136c56_caseD_5d:
    uVar12 = BinarySource_get_uint32(&local_88);
    uVar9 = (uint)uVar12;
    if (bVar2 != 0x62) {
LAB_00136d5d:
      p_Var3 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                (p_Var3,*(undefined4 *)&plug[-0x810].vt,uVar25,pvVar1,iVar8,0);
      len = local_50;
      if ((3 < iVar8 && bVar2 == 0x61) &&
         (psVar13 = share_find_channel_by_server(cs,uVar9), len = local_50,
         psVar13 != (share_channel *)0x0)) {
        if (psVar13->state == 2) {
          p_Var3 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var3 + 8) + 0x58))(p_Var3,psVar13->upstream_id);
          share_remove_channel(cs,psVar13);
          len = local_50;
        }
        else {
          psVar13->state = 1;
        }
      }
      goto LAB_00136b32;
    }
    pVar27 = BinarySource_get_string(local_88.binarysource_);
    _Var5 = ptrlen_eq_string(pVar27,"auth-agent-req@openssh.com");
    if ((_Var5) &&
       (cVar6 = (**(code **)(*(long *)((plug[-0x80e].vt)->accepting + 8) + 0x70))(), cVar6 == '\0'))
    {
      psVar13 = share_find_channel_by_server(cs,uVar9);
      if (psVar13 != (share_channel *)0x0) {
        buf_o = strbuf_new();
        BinarySink_put_uint32(buf_o->binarysink_,(ulong)psVar13->downstream_id);
        send_packet_to_downstream(cs,100,buf_o->s,(int)buf_o->len,(share_channel *)0x0);
LAB_00137430:
        strbuf_free(buf_o);
        len = local_50;
        goto LAB_00136b32;
      }
      pcVar11 = "Agent forwarding request for unrecognised channel %u";
    }
    else {
      _Var5 = ptrlen_eq_string(pVar27,"x11-req");
      if (!_Var5) goto LAB_00136d5d;
      psVar13 = share_find_channel_by_server(cs,uVar9);
      if (psVar13 != (share_channel *)0x0) {
        _Var5 = BinarySource_get_bool(local_88.binarysource_);
        val = BinarySource_get_bool(local_88.binarysource_);
        pVar27 = BinarySource_get_string(local_88.binarysource_);
        iVar8 = x11_identify_auth_proto(pVar27);
        pVar27 = BinarySource_get_string(local_88.binarysource_);
        uVar14 = BinarySource_get_uint32(local_88.binarysource_);
        if ((local_88.binarysource_)->err != BSE_NO_ERROR) {
          pcVar11 = "Truncated CHANNEL_REQUEST(\"x11-req\") packet";
          goto LAB_0013718f;
        }
        if (iVar8 < 0) {
          buf_o = strbuf_new();
          BinarySink_put_uint32(buf_o->binarysink_,(ulong)psVar13->downstream_id);
          send_packet_to_downstream(cs,100,buf_o->s,(int)buf_o->len,(share_channel *)0x0);
        }
        else {
          psVar13->x11_auth_proto = iVar8;
          pcVar11 = (char *)x11_dehexify(pVar27,&psVar13->x11_auth_datalen);
          psVar13->x11_auth_data = pcVar11;
          p_Var3 = (plug[-0x80e].vt)->accepting;
          pXVar19 = (X11FakeAuth *)
                    (**(code **)(*(long *)(p_Var3 + 8) + 0x38))(p_Var3,iVar8,cs,psVar13);
          psVar13->x11_auth_upstream = pXVar19;
          psVar13->x11_one_shot = val;
          buf_o = strbuf_new_nm();
          bs = buf_o->binarysink_;
          BinarySink_put_uint32(bs,uVar12 & 0xffffffff);
          BinarySink_put_stringz(bs,"x11-req");
          BinarySink_put_bool(bs,_Var5);
          BinarySink_put_bool(bs,val);
          BinarySink_put_stringz(bs,psVar13->x11_auth_upstream->protoname);
          BinarySink_put_stringz(bs,psVar13->x11_auth_upstream->datastring);
          local_98 = (int)uVar14;
          BinarySink_put_uint32(bs,(long)local_98);
          p_Var3 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var3 + 8) + 0x48))
                    (p_Var3,*(undefined4 *)&plug[-0x810].vt,0x62,buf_o->s);
        }
        goto LAB_00137430;
      }
      pcVar11 = "X11 forwarding request for unrecognised channel %u";
    }
    pcVar11 = dupprintf(pcVar11,uVar12 & 0xffffffff);
    goto LAB_001371ad;
  default:
    if ((bVar2 == 4) || (bVar2 == 2)) goto switchD_00136c56_caseD_5d;
    if (bVar2 != 1) goto switchD_00136c56_caseD_51;
    share_begin_cleanup(cs);
    len = local_50;
    goto LAB_00136b32;
  }
  if (pcVar11 == (char *)0x0) {
    __assert_fail("err != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x6c6,
                  "void share_got_pkt_from_downstream(struct ssh_sharing_connstate *, int, unsigned char *, int)"
                 );
  }
LAB_001371ad:
  share_disconnect(cs,pcVar11);
LAB_001371b5:
  safefree(pcVar11);
  len = local_50;
  goto LAB_00136b32;
}

Assistant:

static void share_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    ssh_sharing_connstate *cs = container_of(
        plug, ssh_sharing_connstate, plug);
    static const char expected_verstring_prefix[] =
        "SSHCONNECTION@putty.projects.tartarus.org-2.0-";
    unsigned char c;

    crBegin(cs->crLine);

    /*
     * First read the version string from downstream.
     */
    cs->recvlen = 0;
    while (1) {
        crGetChar(c);
        if (c == '\012')
            break;
        if (cs->recvlen >= sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Version string far too long\n");
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        cs->recvbuf[cs->recvlen++] = c;
    }

    /*
     * Now parse the version string to make sure it's at least vaguely
     * sensible, and log it.
     */
    if (cs->recvlen < sizeof(expected_verstring_prefix)-1 ||
        memcmp(cs->recvbuf, expected_verstring_prefix,
               sizeof(expected_verstring_prefix) - 1)) {
        char *buf = dupprintf("Version string did not have expected prefix\n");
        share_disconnect(cs, buf);
        sfree(buf);
        goto dead;
    }
    if (cs->recvlen > 0 && cs->recvbuf[cs->recvlen-1] == '\015')
        cs->recvlen--;                 /* trim off \r before \n */
    ptrlen verstring = make_ptrlen(cs->recvbuf, cs->recvlen);
    log_downstream(cs, "Downstream version string: %.*s",
                   PTRLEN_PRINTF(verstring));
    cs->got_verstring = true;

    /*
     * Loop round reading packets.
     */
    while (1) {
        cs->recvlen = 0;
        while (cs->recvlen < 4) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }
        cs->curr_packetlen = toint(GET_32BIT_MSB_FIRST(cs->recvbuf) + 4);
        if (cs->curr_packetlen < 5 ||
            cs->curr_packetlen > sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Bad packet length %u\n",
                                  (unsigned)cs->curr_packetlen);
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        while (cs->recvlen < cs->curr_packetlen) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }

        share_got_pkt_from_downstream(cs, cs->recvbuf[4],
                                      cs->recvbuf + 5, cs->recvlen - 5);
    }

  dead:;
    crFinishV;
}